

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

int ShowDemoWindowWidgets::Funcs::MyCallback(ImGuiInputTextCallbackData *data)

{
  byte bVar1;
  int iVar2;
  char *new_text;
  
  iVar2 = data->EventFlag;
  if (iVar2 == 0x80000) {
    bVar1 = *data->Buf;
    if ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) {
      *data->Buf = bVar1 ^ 0x20;
    }
    data->BufDirty = true;
    *(int *)data->UserData = *data->UserData + 1;
  }
  else if (iVar2 == 0x80) {
    if (data->EventKey == 4) {
      ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
      new_text = "Pressed Down!";
    }
    else {
      if (data->EventKey != 3) {
        return 0;
      }
      ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
      new_text = "Pressed Up!";
    }
    ImGuiInputTextCallbackData::InsertChars(data,0,new_text,(char *)0x0);
    data->SelectionStart = 0;
    data->SelectionEnd = data->BufTextLen;
  }
  else if (iVar2 == 0x40) {
    ImGuiInputTextCallbackData::InsertChars(data,data->CursorPos,"..",(char *)0x0);
  }
  return 0;
}

Assistant:

static int MyCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackCompletion)
                    {
                        data->InsertChars(data->CursorPos, "..");
                    }
                    else if (data->EventFlag == ImGuiInputTextFlags_CallbackHistory)
                    {
                        if (data->EventKey == ImGuiKey_UpArrow)
                        {
                            data->DeleteChars(0, data->BufTextLen);
                            data->InsertChars(0, "Pressed Up!");
                            data->SelectAll();
                        }
                        else if (data->EventKey == ImGuiKey_DownArrow)
                        {
                            data->DeleteChars(0, data->BufTextLen);
                            data->InsertChars(0, "Pressed Down!");
                            data->SelectAll();
                        }
                    }
                    else if (data->EventFlag == ImGuiInputTextFlags_CallbackEdit)
                    {
                        // Toggle casing of first character
                        char c = data->Buf[0];
                        if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z')) data->Buf[0] ^= 32;
                        data->BufDirty = true;

                        // Increment a counter
                        int* p_int = (int*)data->UserData;
                        *p_int = *p_int + 1;
                    }
                    return 0;
                }